

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisDecoderContext default_context;
  ZydisDecoderState state;
  ZydisDecodedInstruction *instruction_local;
  ZyanUSize length_local;
  void *buffer_local;
  ZydisDecoderContext *context_local;
  ZydisDecoder *decoder_local;
  
  if (((decoder == (ZydisDecoder *)0x0) || (instruction == (ZydisDecodedInstruction *)0x0)) ||
     (buffer == (void *)0x0)) {
    decoder_local._4_4_ = 0x80100004;
  }
  else if (length == 0) {
    decoder_local._4_4_ = 0x80200000;
  }
  else {
    memset(&default_context.reg_info.id_base,0,0x30);
    buffer_local = context;
    if (context == (ZydisDecoderContext *)0x0) {
      buffer_local = &status_047620348_1;
    }
    default_context._24_8_ = decoder;
    memset(buffer_local,0,0x20);
    memset(instruction,0,0x148);
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = (ZyanU8)(0x10 << ((byte)decoder->stack_width & 0x1f));
    decoder_local._4_4_ =
         ZydisCollectOptionalPrefixes
                   ((ZydisDecoderState *)&default_context.reg_info.id_base,instruction);
    if (((decoder_local._4_4_ & 0x80000000) == 0) &&
       (decoder_local._4_4_ =
             ZydisDecodeInstruction
                       ((ZydisDecoderState *)&default_context.reg_info.id_base,instruction),
       (decoder_local._4_4_ & 0x80000000) == 0)) {
      (instruction->raw).encoding2 = instruction->encoding;
      decoder_local._4_4_ = 0x100000;
    }
  }
  return decoder_local._4_4_;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction || !buffer)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    instruction->raw.encoding2 = instruction->encoding;

    return ZYAN_STATUS_SUCCESS;
}